

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  bool bVar2;
  ImGuiTableColumn *column_1;
  int column_n_1;
  ImGuiTableColumn *column;
  float local_18;
  int column_n;
  float visible_width;
  float visible_weight;
  ImGuiTable *table_local;
  
  bVar2 = false;
  if (table->LeftMostStretchedColumn != -1) {
    bVar2 = table->RightMostStretchedColumn != -1;
  }
  if (!bVar2) {
    __assert_fail("table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0x884,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  column_n = 0;
  local_18 = 0.0;
  for (column._4_4_ = 0; column._4_4_ < table->ColumnsCount; column._4_4_ = column._4_4_ + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
    if (((pIVar1->IsEnabled & 1U) != 0) && ((pIVar1->Flags & 8U) != 0)) {
      if (pIVar1->StretchWeight <= 0.0) {
        __assert_fail("column->StretchWeight > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                      ,0x88e,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
      }
      column_n = (int)(pIVar1->StretchWeight + (float)column_n);
      local_18 = pIVar1->WidthRequest + local_18;
    }
  }
  if ((float)column_n <= 0.0 || local_18 <= 0.0) {
    __assert_fail("visible_weight > 0.0f && visible_width > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0x892,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
  }
  column_1._4_4_ = 0;
  while( true ) {
    if (table->ColumnsCount <= column_1._4_4_) {
      return;
    }
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_1._4_4_);
    if ((((pIVar1->IsEnabled & 1U) != 0) && ((pIVar1->Flags & 8U) != 0)) &&
       (pIVar1->StretchWeight = (pIVar1->WidthRequest / local_18) * (float)column_n,
       pIVar1->StretchWeight <= 0.0)) break;
    column_1._4_4_ = column_1._4_4_ + 1;
  }
  __assert_fail("column->StretchWeight > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                ,0x89b,"void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *)");
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}